

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O2

SysCallInt32Result cppnet::OsHandle::Bind(int64_t sockfd,Address *address)

{
  socklen_t __len;
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  undefined1 local_24 [12];
  ulong uStack_18;
  undefined8 local_10;
  
  if (address->_address_type == AT_IPV4) {
    uStack_18 = uStack_18 & 0xffffffff00000000;
    local_24[4] = '\0';
    local_24[5] = '\0';
    local_24[6] = '\0';
    local_24[7] = '\0';
    local_24[8] = '\0';
    local_24[9] = '\0';
    local_24[10] = '\0';
    local_24[0xb] = '\0';
    local_24._0_2_ = 2;
    local_24._2_2_ = address->_port << 8 | address->_port >> 8;
    inet_pton(2,(address->_ip)._M_dataplus._M_p,local_24 + 4);
    __len = 0x10;
  }
  else {
    local_10 = 0;
    local_24[4] = '\0';
    local_24[5] = '\0';
    local_24[6] = '\0';
    local_24[7] = '\0';
    local_24[8] = '\0';
    local_24[9] = '\0';
    local_24[10] = '\0';
    local_24[0xb] = '\0';
    uStack_18 = 0;
    local_24._0_2_ = 10;
    local_24._2_2_ = address->_port << 8 | address->_port >> 8;
    inet_pton(10,(address->_ip)._M_dataplus._M_p,local_24 + 8);
    __len = 0x1c;
  }
  uVar1 = bind((int)sockfd,(sockaddr *)local_24,__len);
  if ((int)uVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    uVar3 = (ulong)*puVar2 << 0x20;
  }
  else {
    uVar3 = 0;
  }
  return (SysCallInt32Result)(uVar1 | uVar3);
}

Assistant:

SysCallInt32Result OsHandle::Bind(int64_t sockfd, Address& address) {
    int32_t ret = -1;
    if (address.GetType() == AT_IPV4) {
        struct sockaddr_in addr;
        memset(&addr, 0, sizeof(addr));

        addr.sin_family = AF_INET;
        addr.sin_port = htons(address.GetAddrPort());
        inet_pton(AF_INET, address.GetIp().c_str(), &addr.sin_addr);
        ret = bind(sockfd, (sockaddr *)&addr, sizeof(sockaddr_in));

    } else {
        struct sockaddr_in6 addr;
        memset(&addr, 0, sizeof(addr));

        addr.sin6_family = AF_INET6;
        addr.sin6_port = htons(address.GetAddrPort());
        inet_pton(AF_INET6, address.GetIp().c_str(), &addr.sin6_addr);
        ret = bind(sockfd, (sockaddr*)&addr, sizeof(sockaddr_in6));
    }

    if (ret < 0) {
        return {ret, errno};
    }
    return {ret, 0};
}